

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O1

vec3 s2_to_r3(float theta,float phi)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3 vVar5;
  
  fVar4 = (theta * 3.1415927) / 180.0;
  fVar3 = (phi * 3.1415927) / 180.0;
  fVar1 = sinf(fVar4);
  fVar2 = cosf(fVar3);
  vVar5.x = fVar2 * fVar1;
  fVar3 = sinf(fVar3);
  fVar4 = cosf(fVar4);
  vVar5.y = fVar3 * fVar1;
  vVar5.z = fVar4;
  return vVar5;
}

Assistant:

dja::vec3 s2_to_r3(float theta, float phi)
{
    theta = radians(theta);
    phi = radians(phi);
    float tmp = sin(theta);
    return dja::vec3(tmp * cos(phi), tmp * sin(phi), cos(theta));
}